

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

ostream * pstack::operator<<(ostream *o,Escape *escape)

{
  ostream *poVar1;
  byte bVar2;
  undefined4 uVar3;
  long lVar4;
  ostream oVar5;
  byte *pbVar6;
  byte *pbVar7;
  undefined8 *puVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  byte *pbVar14;
  uint uVar15;
  uint *local_50;
  undefined8 local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  uVar3 = *(undefined4 *)(o + *(long *)(*(long *)o + -0x18) + 0x18);
  if ((escape->value)._M_string_length != 0) {
    pbVar6 = (byte *)(escape->value)._M_dataplus._M_p;
    do {
      pbVar14 = pbVar6 + 1;
      bVar2 = *pbVar6;
      uVar15 = (uint)bVar2;
      switch(bVar2) {
      case 8:
        lVar11 = 2;
        pcVar13 = "\\b";
        break;
      case 9:
        lVar11 = 2;
        pcVar13 = "\\t";
        break;
      case 10:
        lVar11 = 2;
        pcVar13 = "\\n";
        break;
      case 0xb:
switchD_00150a1e_caseD_b:
        if (bVar2 < 0x20) {
          std::__ostream_insert<char,std::char_traits<char>>(o,"\\u",2);
          *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) =
               *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::_M_insert<unsigned_long>((ulong)o);
          pbVar6 = pbVar14;
        }
        else {
          if (-1 < (char)bVar2) {
            local_50 = (uint *)CONCAT71(local_50._1_7_,bVar2);
            lVar11 = 1;
            pcVar13 = (char *)&local_50;
            break;
          }
          uVar10 = 0x80;
          iVar12 = 0;
          do {
            iVar9 = iVar12;
            if (iVar9 == -8) {
              puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
              local_50 = &local_40;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"malformed UTF-8 string","");
              *puVar8 = &PTR__JSONEncodingError_0017c3f8;
              puVar8[1] = puVar8 + 3;
              if (local_50 == &local_40) {
                *(uint *)(puVar8 + 3) = local_40;
                *(undefined4 *)((long)puVar8 + 0x1c) = uStack_3c;
                *(undefined4 *)(puVar8 + 4) = uStack_38;
                *(undefined4 *)((long)puVar8 + 0x24) = uStack_34;
              }
              else {
                puVar8[1] = local_50;
                puVar8[3] = CONCAT44(uStack_3c,local_40);
              }
              puVar8[2] = local_48;
              local_48 = 0;
              local_40 = local_40 & 0xffffff00;
              local_50 = &local_40;
              __cxa_throw(puVar8,&JSONEncodingError::typeinfo,JSONEncodingError::~JSONEncodingError)
              ;
            }
            uVar15 = uVar15 & ~uVar10;
            uVar10 = uVar10 >> 1;
            iVar12 = iVar9 + -1;
          } while ((uVar15 & uVar10) != 0);
          pbVar7 = pbVar14;
          if (iVar12 != -1) {
            pbVar7 = pbVar6 + (ulong)(-iVar12 - 2) + 2;
            do {
              if ((*pbVar14 & 0xc0) != 0x80) {
                puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
                local_50 = &local_40;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_50,"illegal character in multibyte sequence","");
                *puVar8 = &PTR__JSONEncodingError_0017c3f8;
                puVar8[1] = puVar8 + 3;
                if (local_50 == &local_40) {
                  *(uint *)(puVar8 + 3) = local_40;
                  *(undefined4 *)((long)puVar8 + 0x1c) = uStack_3c;
                  *(undefined4 *)(puVar8 + 4) = uStack_38;
                  *(undefined4 *)((long)puVar8 + 0x24) = uStack_34;
                }
                else {
                  puVar8[1] = local_50;
                  puVar8[3] = CONCAT44(uStack_3c,local_40);
                }
                puVar8[2] = local_48;
                local_48 = 0;
                local_40 = local_40 & 0xffffff00;
                local_50 = &local_40;
                __cxa_throw(puVar8,&JSONEncodingError::typeinfo,
                            JSONEncodingError::~JSONEncodingError);
              }
              pbVar14 = pbVar14 + 1;
              iVar9 = iVar9 + 1;
            } while (iVar9 != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>(o,"\\u",2);
          lVar11 = *(long *)o;
          lVar4 = *(long *)(lVar11 + -0x18);
          *(uint *)(o + lVar4 + 0x18) = *(uint *)(o + lVar4 + 0x18) & 0xffffffb5 | 8;
          lVar11 = *(long *)(lVar11 + -0x18);
          poVar1 = o + lVar11;
          if (o[lVar11 + 0xe1] == (ostream)0x0) {
            oVar5 = (ostream)std::ios::widen((char)poVar1);
            poVar1[0xe0] = oVar5;
            poVar1[0xe1] = (ostream)0x1;
          }
          poVar1[0xe0] = (ostream)0x30;
          *(undefined8 *)(o + *(long *)(*(long *)o + -0x18) + 0x10) = 4;
          std::ostream::_M_insert<unsigned_long>((ulong)o);
          pbVar6 = pbVar7;
        }
        goto LAB_00150b05;
      case 0xc:
        lVar11 = 2;
        pcVar13 = "\\f";
        break;
      case 0xd:
        lVar11 = 2;
        pcVar13 = "\\r";
        break;
      default:
        if (bVar2 == 0x22) {
          lVar11 = 2;
          pcVar13 = "\\\"";
        }
        else {
          if (bVar2 != 0x5c) goto switchD_00150a1e_caseD_b;
          lVar11 = 2;
          pcVar13 = "\\\\";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(o,pcVar13,lVar11);
      pbVar6 = pbVar14;
LAB_00150b05:
    } while (pbVar6 != (byte *)((escape->value)._M_dataplus._M_p + (escape->value)._M_string_length)
            );
  }
  *(undefined4 *)(o + *(long *)(*(long *)o + -0x18) + 0x18) = uVar3;
  return o;
}

Assistant:

inline std::ostream & operator << (std::ostream &o, const Escape &escape)
{
    auto flags(o.flags());
    for (auto i = escape.value.begin(); i != escape.value.end();) {
        int c;
        switch (c = (unsigned char)*i++) {
            case '\b': o << "\\b"; break;
            case '\f': o << "\\f"; break;
            case '\n': o << "\\n"; break;
            case '"': o << "\\\""; break;
            case '\\': o << "\\\\"; break;
            case '\r': o << "\\r"; break;
            case '\t': o << "\\t"; break;
            default:
                if (unsigned(c) < 32) {
                    o << "\\u" << std::hex << unsigned(c);
                } else if (c & 0x80) {
                    // multibyte UTF-8: build up the unicode codepoint.
                    unsigned long v = c;
                    int count = 0;
                    for (int mask = 0x80; mask & v; mask >>= 1) {
                        if (mask == 0)
                            throw JSONEncodingError("malformed UTF-8 string");
                        count++;
                        v &= ~mask;
                    }
                    while (--count) {
                        c = (unsigned char)*i++;
                        if ((c & 0xc0) != 0x80)
                            throw JSONEncodingError("illegal character in multibyte sequence");
                        v = (v << 6) | (c & 0x3f);
                    }
                    o << "\\u" << std::hex << std::setfill('0') << std::setw(4) << v;
                } else {
                    o << (char)c;
                }
                break;
        }
    }
    o.flags(flags);
    return o;
}